

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_zip.c
# Opt level: O1

void verify_extract_length_at_end(archive *a,int seek_checks)

{
  int iVar1;
  wchar_t wVar2;
  mode_t mVar3;
  char *pcVar4;
  longlong v2;
  longlong v1;
  archive_entry *ae;
  archive_entry *local_38;
  
  iVar1 = archive_read_next_header(a,&local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'×',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
  wVar2 = archive_entry_is_encrypted(local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'Ù',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'Ú',(long)iVar1,"archive_read_has_encrypted_entries(a)",0,"0",a);
  pcVar4 = archive_entry_pathname(local_38);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_zip.c"
             ,L'Û',"hello.txt","\"hello.txt\"",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,
             L'\0');
  if (seek_checks == 0) {
    wVar2 = archive_entry_size_is_set(local_38);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_zip.c"
                     ,L'á',(uint)(wVar2 == L'\0'),"!archive_entry_size_is_set(ae)",(void *)0x0);
    v2 = archive_entry_size(local_38);
    pcVar4 = "e + 0";
    wVar2 = L'â';
    v1 = 0;
  }
  else {
    mVar3 = archive_entry_mode(local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_zip.c"
                        ,L'Ý',0x81a4,"AE_IFREG | 0644",(ulong)mVar3,"archive_entry_mode(ae)",
                        (void *)0x0);
    wVar2 = archive_entry_size_is_set(local_38);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_zip.c"
                     ,L'Þ',wVar2,"archive_entry_size_is_set(ae)",(void *)0x0);
    v2 = archive_entry_size(local_38);
    pcVar4 = "e + 6";
    v1 = 6;
    wVar2 = L'ß';
  }
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,wVar2,v1,pcVar4 + 4,v2,"archive_entry_size(ae)",(void *)0x0);
  iVar1 = archive_read_extract(a,local_38,0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'æ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_extract(a, ae, 0)",a);
  assertion_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_zip.c"
             ,L'ç',"hello\n",L'\x06',"hello.txt");
  iVar1 = archive_read_close(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'ï',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",a);
  iVar1 = archive_read_free(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'ð',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",a);
  return;
}

Assistant:

static void
verify_extract_length_at_end(struct archive *a, int seek_checks)
{
	struct archive_entry *ae;

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));

	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), 0);
	assertEqualString("hello.txt", archive_entry_pathname(ae));
	if (seek_checks) {
		assertEqualInt(AE_IFREG | 0644, archive_entry_mode(ae));
		assert(archive_entry_size_is_set(ae));
		assertEqualInt(6, archive_entry_size(ae));
	} else {
		assert(!archive_entry_size_is_set(ae));
		assertEqualInt(0, archive_entry_size(ae));
	}

	if (libz_enabled) {
		assertEqualIntA(a, ARCHIVE_OK, archive_read_extract(a, ae, 0));
		assertFileContents("hello\x0A", 6, "hello.txt");
	} else {
		assertEqualIntA(a, ARCHIVE_FAILED, archive_read_extract(a, ae, 0));
		assertEqualString(archive_error_string(a),
		    "Unsupported ZIP compression method (deflation)");
		assert(archive_errno(a) != 0);
	}

	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_free(a));
}